

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O1

pair<unsigned_long,_unsigned_long> __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
::rebucket(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
           *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *param_1,
          bool count_unfinished)

{
  pointer puVar1;
  pointer puVar2;
  unsigned_long uVar3;
  bool bVar4;
  unsigned_long uVar5;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __tmp;
  unsigned_long uVar6;
  pointer puVar7;
  unsigned_long uVar8;
  ulong uVar9;
  unsigned_long uVar10;
  ulong uVar11;
  long lVar12;
  unsigned_long uVar13;
  bool bVar14;
  pair<unsigned_long,_unsigned_long> pVar15;
  pair<unsigned_long,_unsigned_long> result;
  size_t local_max;
  pair<unsigned_long,_unsigned_long> local_result;
  pair<unsigned_long,_unsigned_long> last_element;
  unsigned_long local_a8;
  unsigned_long uStack_a0;
  custom_op<std::pair<unsigned_long,_unsigned_long>,_true> local_90;
  ulong local_50;
  ulong local_48;
  pair<unsigned_long,_unsigned_long> local_40;
  
  puVar7 = (this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
  puVar1 = (this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((puVar7 == puVar1) ||
     (puVar2 = (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish,
     (long)puVar7 - (long)puVar1 !=
     (long)puVar2 -
     (long)(param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start)) {
    __assert_fail("local_B.size() == local_B2.size() && local_B.size() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                  ,0x3ed,
                  "std::pair<size_t, size_t> suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned long, true>::rebucket(std::vector<index_t> &, bool) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                 );
  }
  uVar3 = (this->part).prefix;
  local_40.first = puVar7[-1];
  local_40.second = puVar2[-1];
  pVar15 = mxx::right_shift<std::pair<unsigned_long,unsigned_long>>(&local_40,&this->comm);
  bVar14 = true;
  if ((((this->comm).m_rank != 0) &&
      (pVar15.first ==
       *(this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start)) &&
     (pVar15.second ==
      *(param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_start)) {
    bVar14 = false;
  }
  puVar7 = (this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar1 = (this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
  uVar9 = (long)puVar1 - (long)puVar7 >> 3;
  if (1 < uVar9) {
    puVar2 = (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = 0;
    bVar4 = bVar14;
    do {
      bVar14 = true;
      if (puVar7[lVar12] == puVar7[lVar12 + 1]) {
        bVar14 = puVar2[lVar12] != puVar2[lVar12 + 1];
      }
      uVar6 = uVar3 + 1 + lVar12;
      if (!bVar4) {
        uVar6 = 0;
      }
      puVar7[lVar12] = uVar6;
      lVar12 = lVar12 + 1;
      bVar4 = bVar14;
    } while (uVar9 - 1 != lVar12);
  }
  uVar6 = this->local_size + uVar3;
  if (!bVar14) {
    uVar6 = 0;
  }
  puVar1[-1] = uVar6;
  uVar6 = 0;
  uVar13 = 0;
  if (count_unfinished) {
    uVar6 = mxx::right_shift<unsigned_long>(puVar1 + -1,&this->comm);
    local_50 = 0;
    if ((uVar6 != 0) && ((this->comm).m_rank != 0)) {
      local_50 = (ulong)(*(this->local_B).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start == 0);
    }
    puVar7 = (this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar9 = (long)(this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 3;
    local_48 = local_50;
    if (1 < uVar9) {
      uVar11 = 1;
      do {
        if ((puVar7[uVar11 - 1] != 0) && (puVar7[uVar11] == 0)) {
          local_50 = local_50 + 1;
          local_48 = local_48 + 1;
        }
        local_48 = local_48 + (puVar7[uVar11] == 0);
        uVar11 = uVar11 + 1;
      } while (uVar9 != uVar11);
    }
    mxx::custom_op<std::pair<unsigned_long,unsigned_long>,true>::
    custom_op<pair_sum<unsigned_long,unsigned_long>>
              ((custom_op<std::pair<unsigned_long,unsigned_long>,true> *)&local_90);
    local_a8 = 0;
    uStack_a0 = 0;
    MPI_Allreduce(&local_50,&local_a8,1,local_90.m_type_copy,local_90.m_op,(this->comm).mpi_comm);
    mxx::custom_op<std::pair<unsigned_long,_unsigned_long>,_true>::~custom_op(&local_90);
    uVar6 = local_a8;
    uVar13 = uStack_a0;
  }
  puVar7 = (this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
  local_90._vptr_custom_op = (_func_int **)0x0;
  do {
    if (puVar7 == (this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start) break;
    local_90._vptr_custom_op = (_func_int **)puVar7[-1];
    puVar7 = puVar7 + -1;
  } while (local_90._vptr_custom_op == (_func_int **)0x0);
  uVar8 = mxx::exscan<unsigned_long,mxx::max<unsigned_long>>(&local_90);
  puVar7 = (this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  lVar12 = (long)(this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar7;
  if (lVar12 != 0) {
    lVar12 = lVar12 >> 3;
    uVar10 = 0;
    if ((this->comm).m_rank == 0) {
      uVar8 = uVar10;
    }
    do {
      uVar5 = puVar7[uVar10];
      if (puVar7[uVar10] == 0) {
        puVar7[uVar10] = uVar8;
        uVar5 = uVar8;
      }
      uVar8 = uVar5;
      uVar11 = puVar7[uVar10];
      uVar9 = uVar10 + uVar3 + 1;
      if (uVar9 < uVar11) {
        __assert_fail("local_B[i] <= i+prefix+1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x43f,
                      "std::pair<size_t, size_t> suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned long, true>::rebucket(std::vector<index_t> &, bool) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                     );
      }
      if (((uVar10 != 0) && (uVar9 != uVar11)) && (puVar7[uVar10 - 1] != uVar11)) {
        __assert_fail("i == 0 || (local_B[i-1] == local_B[i] || local_B[i] == i+prefix+1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x441,
                      "std::pair<size_t, size_t> suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned long, true>::rebucket(std::vector<index_t> &, bool) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                     );
      }
      uVar10 = uVar10 + 1;
    } while (lVar12 + (ulong)(lVar12 == 0) != uVar10);
  }
  pVar15.second = uVar13;
  pVar15.first = uVar6;
  return pVar15;
}

Assistant:

std::pair<size_t,size_t> rebucket(std::vector<index_t>& local_B2, bool count_unfinished) {
    /*
     * NOTE: buckets are indexed by the global index of the first element in
     *       the bucket with a ONE-BASED-INDEX (since bucket number `0` is
     *       reserved for out-of-bounds)
     */
    // assert inputs are of equal size
    assert(local_B.size() == local_B2.size() && local_B.size() > 0);

    // init result
    std::pair<size_t,size_t> result;

    // get my global starting index
    size_t prefix = part.excl_prefix_size();

    /*
     * assign local zero or one, depending on whether the bucket is the same
     * as the previous one
     */

    std::pair<index_t, index_t> last_element = std::make_pair(local_B.back(), local_B2.back());
    std::pair<index_t, index_t> prevRight = mxx::right_shift(last_element, comm);
    bool firstDiff = false;
    if (comm.rank() == 0) {
        firstDiff = true;
    } else if (prevRight.first != local_B[0] || prevRight.second != local_B2[0]) {
        firstDiff = true;
    }

    // set local_B1 to `1` if previous entry is different:
    // i.e., mark start of buckets
    bool nextDiff = firstDiff;
    for (std::size_t i = 0; i+1 < local_B.size(); ++i) {
        bool setOne = nextDiff;
        nextDiff = (local_B[i] != local_B[i+1] || local_B2[i] != local_B2[i+1]);
        local_B[i] = setOne ? prefix+i+1 : 0;
    }

    local_B.back() = nextDiff ? prefix+(local_size-1)+1 : 0;

    if (count_unfinished) {
        // count the number of unfinished elements and buckets
        index_t prev_right = mxx::right_shift(local_B.back(), comm);
        index_t local_unfinished_buckets = 0;
        index_t local_unfinished_els = 0;
        if (comm.rank() != 0) {
            local_unfinished_buckets = (prev_right > 0 && local_B[0] == 0) ? 1 : 0;
            local_unfinished_els = local_unfinished_buckets;
        }
        for (size_t i = 1; i < local_B.size(); ++i) {
            if(local_B[i-1] > 0 && local_B[i] == 0) {
                ++local_unfinished_buckets;
                ++local_unfinished_els;
            }
            if (local_B[i] == 0) {
                ++local_unfinished_els;
            }
        }
        std::pair<size_t,size_t> local_result(local_unfinished_buckets, local_unfinished_els);
        result = mxx::allreduce(local_result, pair_sum<size_t,size_t>(), comm);
    }


    /*
     * Global prefix MAX:
     *  - such that for every item we have it's bucket number, where the
     *    bucket number is equal to the first index in the bucket
     *    this way buckets who are finished, will never receive a new
     *    number.
     */
    // 1.) find the max in the local sequence. since the max is the last index
    //     of a bucket, this should be somewhere at the end -> start scanning
    //     from the end
    auto rev_it = local_B.rbegin();
    size_t local_max = 0;
    while (rev_it != local_B.rend() && (local_max = *rev_it) == 0)
        ++rev_it;

    // 2.) distributed scan with max() to get starting max for each sequence
    size_t pre_max = mxx::exscan(local_max, mxx::max<size_t>(), comm);
    if (comm.rank() == 0)
        pre_max = 0;

    // 3.) linear scan and assign bucket numbers
    for (size_t i = 0; i < local_B.size(); ++i) {
        if (local_B[i] == 0)
            local_B[i] = pre_max;
        else
            pre_max = local_B[i];
        assert(local_B[i] <= i+prefix+1);
        // first element of bucket has id of it's own global index:
        assert(i == 0 || (local_B[i-1] ==  local_B[i] || local_B[i] == i+prefix+1));
    }

    return result;
}